

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_scientific.cpp
# Opt level: O1

void __thiscall icu_63::number::impl::ScientificHandler::getMultiplier(ScientificHandler *this)

{
  return;
}

Assistant:

int32_t ScientificHandler::getMultiplier(int32_t magnitude) const {
    int32_t interval = fSettings.fEngineeringInterval;
    int32_t digitsShown;
    if (fSettings.fRequireMinInt) {
        // For patterns like "000.00E0" and ".00E0"
        digitsShown = interval;
    } else if (interval <= 1) {
        // For patterns like "0.00E0" and "@@@E0"
        digitsShown = 1;
    } else {
        // For patterns like "##0.00"
        digitsShown = ((magnitude % interval + interval) % interval) + 1;
    }
    return digitsShown - magnitude - 1;
}